

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

bool withinB44ErrorBounds(uint16_t (*A) [4],uint16_t (*B) [4])

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  int i_1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ostream *poVar14;
  byte bVar15;
  int i;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ushort uVar21;
  int iVar22;
  int iVar23;
  bool bVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [16];
  short sVar30;
  short sVar35;
  short sVar36;
  short sVar38;
  undefined4 uVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  uint16_t A1 [16];
  int d [16];
  ushort local_138 [22];
  undefined4 local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8 [32];
  uint16_t (*local_78) [4];
  uint16_t (*local_70) [4];
  ulong local_68;
  ulong local_60;
  ulong auStack_58 [5];
  undefined1 auVar28 [16];
  ushort uVar29;
  undefined1 auVar33 [16];
  
  bVar24 = true;
  lVar18 = 0;
  do {
    bVar24 = (bool)(bVar24 & A[lVar18] == B[lVar18]);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  if (!bVar24) {
    uVar12 = 0;
    do {
      uVar29 = A[uVar12 >> 2 & 0x3fffffff][(uint)uVar12 & 3];
      if ((~uVar29 & 0x7c00) == 0) {
        *(undefined2 *)((long)auStack_58 + uVar12 * 2) = 0x8000;
      }
      else {
        if ((short)uVar29 < 0) {
          uVar29 = ~uVar29;
        }
        else {
          uVar29 = uVar29 | 0x8000;
        }
        *(ushort *)((long)auStack_58 + uVar12 * 2) = uVar29;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x10);
    lVar18 = 0;
    auVar32 = (undefined1  [16])0x0;
    do {
      auVar27 = psubusw(*(undefined1 (*) [16])((long)auStack_58 + lVar18 * 2),auVar32);
      auVar25._0_2_ = auVar27._0_2_ + auVar32._0_2_;
      auVar25._2_2_ = auVar27._2_2_ + auVar32._2_2_;
      auVar25._4_2_ = auVar27._4_2_ + auVar32._4_2_;
      auVar25._6_2_ = auVar27._6_2_ + auVar32._6_2_;
      auVar25._8_2_ = auVar27._8_2_ + auVar32._8_2_;
      auVar25._10_2_ = auVar27._10_2_ + auVar32._10_2_;
      auVar28._12_2_ = auVar27._12_2_ + auVar32._12_2_;
      auVar28._0_12_ = auVar25;
      auVar28._14_2_ = auVar27._14_2_ + auVar32._14_2_;
      lVar18 = lVar18 + 8;
      auVar32 = auVar28;
    } while (lVar18 != 0x10);
    auVar31._4_4_ = auVar28._12_4_;
    auVar31._0_4_ = auVar25._8_4_;
    auVar31._8_4_ = auVar25._8_4_;
    auVar31._12_4_ = auVar28._12_4_;
    auVar32 = psubusw(auVar31,auVar28);
    sVar30 = auVar32._0_2_ + auVar25._0_2_;
    sVar35 = auVar32._2_2_ + auVar25._2_2_;
    sVar36 = auVar32._4_2_ + auVar25._4_2_;
    sVar38 = auVar32._6_2_ + auVar25._6_2_;
    auVar33._0_8_ = CONCAT26(sVar38,CONCAT24(sVar36,CONCAT22(sVar35,sVar30)));
    auVar33._8_2_ = auVar32._8_2_ + auVar25._8_2_;
    auVar33._10_2_ = auVar32._10_2_ + auVar25._10_2_;
    auVar33._12_2_ = auVar32._12_2_ + auVar28._12_2_;
    auVar33._14_2_ = auVar32._14_2_ + auVar28._14_2_;
    uVar37 = (undefined4)((ulong)auVar33._0_8_ >> 0x20);
    auVar32._4_4_ = uVar37;
    auVar32._0_4_ = uVar37;
    auVar32._8_4_ = uVar37;
    auVar32._12_4_ = uVar37;
    auVar32 = psubusw(auVar32,auVar33);
    sVar30 = auVar32._0_2_ + sVar30;
    uVar29 = auVar32._2_2_ + sVar35;
    auVar26._0_8_ =
         CONCAT26(auVar32._6_2_ + sVar38,CONCAT24(auVar32._4_2_ + sVar36,CONCAT22(uVar29,sVar30)));
    auVar26._8_2_ = auVar32._8_2_ + auVar33._8_2_;
    auVar26._10_2_ = auVar32._10_2_ + auVar33._10_2_;
    auVar27._12_2_ = auVar32._12_2_ + auVar33._12_2_;
    auVar27._0_12_ = auVar26;
    auVar27._14_2_ = auVar32._14_2_ + auVar33._14_2_;
    auVar34._2_2_ = 0;
    auVar34._0_2_ = uVar29;
    auVar34._4_4_ = (uint)((ulong)auVar26._0_8_ >> 0x30);
    auVar34._8_4_ = auVar26._8_4_ >> 0x10;
    auVar34._12_4_ = auVar27._12_4_ >> 0x10;
    auVar32 = psubusw(auVar34,auVar27);
    local_138[0] = auVar32._0_2_ + sVar30;
    local_10c = CONCAT22(auVar32._2_2_ + uVar29,local_138[0]);
    uVar17 = (uint)local_138[0];
    iVar16 = -1;
    do {
      iVar1 = iVar16 + 1;
      bVar15 = (byte)iVar1;
      uVar11 = iVar16 + 2;
      uVar19 = ~(-1 << (bVar15 & 0x1f));
      lVar18 = 0;
      do {
        uVar12 = *(ulong *)((long)auStack_58 + lVar18 * 2);
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar12;
        auVar7._12_2_ = (short)(uVar12 >> 0x30);
        auVar8._8_2_ = (short)(uVar12 >> 0x20);
        auVar8._0_8_ = uVar12;
        auVar8._10_4_ = auVar7._10_4_;
        auVar10._6_8_ = 0;
        auVar10._0_6_ = auVar8._8_6_;
        auVar9._4_2_ = (short)(uVar12 >> 0x10);
        auVar9._0_4_ = (uint)uVar12;
        auVar9._6_8_ = SUB148(auVar10 << 0x40,6);
        uVar3 = (uVar17 - ((uint)uVar12 & 0xffff)) * 2;
        uVar4 = (uVar17 - auVar9._4_4_) * 2;
        uVar5 = (uVar17 - auVar8._8_4_) * 2;
        uVar6 = (uVar17 - (auVar7._10_4_ >> 0x10)) * 2;
        uVar12 = (ulong)uVar11;
        local_f8[lVar18] = (int)(uVar3 + uVar19 + (uVar3 >> uVar12 & 1)) >> ZEXT416(uVar11);
        local_f8[lVar18 + 1] = (int)(uVar4 + uVar19 + (uVar4 >> uVar12 & 1)) >> ZEXT416(uVar11);
        local_f8[lVar18 + 2] = (int)(uVar5 + uVar19 + (uVar5 >> uVar12 & 1)) >> ZEXT416(uVar11);
        local_f8[lVar18 + 3] = (int)(uVar6 + uVar19 + (uVar6 >> uVar12 & 1)) >> ZEXT416(uVar11);
        lVar18 = lVar18 + 4;
      } while (lVar18 != 0x10);
      iVar20 = (local_f8[0] - local_f8[4]) + 0x20;
      uVar11 = local_f8[4] - local_f8[8];
      local_68 = (ulong)uVar11;
      local_f8[0x11] = uVar11 + 0x20;
      uVar19 = local_f8[8] - local_f8[0xc];
      local_60 = (ulong)uVar19;
      local_f8[0x12] = uVar19 + 0x20;
      local_108 = local_f8[0];
      local_f8[0x13] = (local_f8[0] - local_f8[1]) + 0x20;
      local_f8[0x14] = (local_f8[4] - local_f8[5]) + 0x20;
      local_f8[0x15] = (local_f8[8] - local_f8[9]) + 0x20;
      local_f8[0x16] = (local_f8[0xc] - local_f8[0xd]) + 0x20;
      local_fc = (local_f8[1] - local_f8[2]) + 0x20;
      local_f8[0x17] = local_fc;
      local_f8[0x18] = (local_f8[5] - local_f8[6]) + 0x20;
      local_104 = (local_f8[9] - local_f8[10]) + 0x20;
      local_f8[0x19] = local_104;
      local_100 = (local_f8[0xd] - local_f8[0xe]) + 0x20;
      local_f8[0x1a] = local_100;
      local_f8[0x1b] = (local_f8[2] - local_f8[3]) + 0x20;
      local_f8[0x1c] = (local_f8[6] - local_f8[7]) + 0x20;
      local_f8[0x1d] = (local_f8[10] - local_f8[0xb]) + 0x20;
      local_f8[0x1e] = (local_f8[0xe] - local_f8[0xf]) + 0x20;
      lVar18 = 1;
      iVar22 = iVar20;
      iVar23 = iVar20;
      do {
        iVar16 = local_f8[lVar18 + 0x10];
        if (iVar16 <= iVar23) {
          iVar23 = iVar16;
        }
        if (iVar16 < iVar22) {
          iVar16 = iVar22;
        }
        iVar22 = iVar16;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xf);
      iVar16 = iVar1;
    } while ((iVar23 < 0) || (0x3f < iVar22));
    local_138[0] = local_138[0] - (short)(local_f8[0] << (bVar15 & 0x1f));
    sVar35 = (short)(-0x20 << (bVar15 & 0x1f));
    sVar30 = local_138[0] + sVar35;
    local_138[4] = (short)(iVar20 << (bVar15 & 0x1f)) + sVar30;
    local_138[1] = (short)(local_f8[0x13] << (bVar15 & 0x1f)) + sVar30;
    local_138[8] = (short)(uVar11 << (bVar15 & 0x1f)) + local_138[4];
    local_138[0xc] = (short)(uVar19 + uVar11 << (bVar15 & 0x1f)) + local_138[4];
    local_138[5] = (short)(local_f8[0x14] << (bVar15 & 0x1f)) + sVar35 + local_138[4];
    local_138[9] = (short)(local_f8[0x15] << (bVar15 & 0x1f)) + sVar35 + local_138[8];
    local_138[0xd] = (short)(local_f8[0x16] << (bVar15 & 0x1f)) + sVar35 + local_138[0xc];
    local_138[2] = (short)(local_fc << (bVar15 & 0x1f)) + sVar35 + local_138[1];
    local_138[6] = (short)(local_f8[0x18] << (bVar15 & 0x1f)) + sVar35 + local_138[5];
    local_138[10] = (short)(local_104 << (bVar15 & 0x1f)) + sVar35 + local_138[9];
    local_138[0xe] = (short)(local_100 << (bVar15 & 0x1f)) + sVar35 + local_138[0xd];
    local_138[3] = (short)(local_f8[0x1b] << (bVar15 & 0x1f)) + sVar35 + local_138[2];
    local_138[7] = (short)(local_f8[0x1c] << (bVar15 & 0x1f)) + sVar35 + local_138[6];
    local_138[0xb] = (short)(local_f8[0x1d] << (bVar15 & 0x1f)) + sVar35 + local_138[10];
    local_138[0xf] = (short)(local_f8[0x1e] << (bVar15 & 0x1f)) + sVar35 + local_138[0xe];
    uVar12 = 0;
    bVar24 = false;
    do {
      uVar13 = uVar12 >> 2 & 0x3fffffff;
      uVar17 = (uint)uVar12 & 3;
      uVar29 = B[uVar13][uVar17];
      uVar21 = uVar29 | 0x8000;
      if ((short)uVar29 < 0) {
        uVar21 = ~uVar29;
      }
      uVar29 = local_138[uVar12];
      if ((uVar29 + 5 < (uint)uVar21) || ((int)(uint)uVar21 < (int)(uVar29 - 5))) {
        uVar2 = A[uVar13][uVar17];
        local_78 = A;
        local_70 = B;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"B44 idx ",8);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": B bits ",9);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
        poVar14 = std::ostream::_M_insert<double>
                            ((double)*(float *)(_imath_half_to_float_table + (ulong)uVar21 * 4));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,") too different from A1 bits ",0x1d);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
        poVar14 = std::ostream::_M_insert<double>
                            ((double)*(float *)(_imath_half_to_float_table + (ulong)uVar29 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," orig ",6);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
        poVar14 = std::ostream::_M_insert<double>
                            ((double)*(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        return bVar24;
      }
      bVar24 = 0xe < uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x10);
  }
  return true;
}

Assistant:

inline bool
withinB44ErrorBounds (const uint16_t A[4][4], const uint16_t B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    uint16_t t[16];

    for (int i = 0; i < 16; ++i)
    {
        uint16_t Abits = A[i / 4][i % 4];

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    uint16_t tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    uint16_t  A1[16];
    const int bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        uint16_t A1bits = A1[i];
        uint16_t Bbits  = B[i / 4][i % 4];
        uint16_t Abits  = A[i / 4][i % 4];

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5)
        {
            std::cerr << "B44 idx " << i << ": B bits " << std::hex << Bbits
                      << std::dec << " (" << imath_half_to_float (Bbits)
                      << ") too different from A1 bits " << std::hex << A1bits
                      << std::dec << " (" << imath_half_to_float (A1bits) << ")"
                      << " orig " << std::hex << Abits << std::dec << " ("
                      << imath_half_to_float (Abits) << ")" << std::endl;
            return false;
        }
    }

    return true;
}